

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

void __thiscall tf::Executor::_increment_topology(Executor *this)

{
  std::mutex::lock(&this->_topology_mutex);
  this->_num_topologies = this->_num_topologies + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->_topology_mutex);
  return;
}

Assistant:

inline void Executor::_increment_topology() {
#if __cplusplus >= TF_CPP20
  _num_topologies.fetch_add(1, std::memory_order_relaxed);
#else
  std::lock_guard<std::mutex> lock(_topology_mutex);
  ++_num_topologies;
#endif
}